

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<float> * __thiscall cimg_library::CImg<float>::fill(CImg<float> *this,float *val)

{
  float fVar1;
  float *pfVar2;
  bool bVar3;
  long lVar4;
  ulongT uVar5;
  float *_maxptrd;
  float *ptrd;
  float *val_local;
  CImg<float> *this_local;
  
  bVar3 = is_empty(this);
  if (!bVar3) {
    if ((*val != 0.0) || (NAN(*val))) {
      _maxptrd = this->_data;
      pfVar2 = this->_data;
      uVar5 = size(this);
      for (; _maxptrd < pfVar2 + uVar5; _maxptrd = _maxptrd + 1) {
        *_maxptrd = *val;
      }
    }
    else {
      pfVar2 = this->_data;
      fVar1 = *val;
      lVar4 = (long)fVar1;
      uVar5 = size(this);
      memset(pfVar2,(uint)(byte)((byte)lVar4 |
                                (byte)(long)(fVar1 - 9.223372e+18) & (byte)(lVar4 >> 0x3f)),
             uVar5 << 2);
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }